

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

_Bool array_container_validate(array_container_t *v,char **reason)

{
  int i;
  uint16_t prev;
  char **reason_local;
  array_container_t *v_local;
  _Bool local_1;
  
  if (v->capacity < 0) {
    *reason = "negative capacity";
    local_1 = false;
  }
  else if (v->cardinality < 0) {
    *reason = "negative cardinality";
    local_1 = false;
  }
  else if (v->capacity < v->cardinality) {
    *reason = "cardinality exceeds capacity";
    local_1 = false;
  }
  else if (v->cardinality < 0x1001) {
    if (v->cardinality == 0) {
      *reason = "zero cardinality";
      local_1 = false;
    }
    else if (v->array == (uint16_t *)0x0) {
      *reason = "NULL array pointer";
      local_1 = false;
    }
    else {
      prev = *v->array;
      for (i = 1; i < v->cardinality; i = i + 1) {
        if (v->array[i] <= prev) {
          *reason = "array elements not strictly increasing";
          return false;
        }
        prev = v->array[i];
      }
      local_1 = true;
    }
  }
  else {
    *reason = "cardinality exceeds DEFAULT_MAX_SIZE";
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool array_container_validate(const array_container_t *v, const char **reason) {
    if (v->capacity < 0) {
        *reason = "negative capacity";
        return false;
    }
    if (v->cardinality < 0) {
        *reason = "negative cardinality";
        return false;
    }
    if (v->cardinality > v->capacity) {
        *reason = "cardinality exceeds capacity";
        return false;
    }
    if (v->cardinality > DEFAULT_MAX_SIZE) {
        *reason = "cardinality exceeds DEFAULT_MAX_SIZE";
        return false;
    }
    if (v->cardinality == 0) {
        *reason = "zero cardinality";
        return false;
    }

    if (v->array == NULL) {
        *reason = "NULL array pointer";
        return false;
    }
    uint16_t prev = v->array[0];
    for (int i = 1; i < v->cardinality; ++i) {
        if (v->array[i] <= prev) {
            *reason = "array elements not strictly increasing";
            return false;
        }
        prev = v->array[i];
    }

    return true;
}